

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-interpreter.h
# Opt level: O0

Flow * __thiscall
wasm::ModuleRunnerBase<wasm::ModuleRunner>::visitCall
          (Flow *__return_storage_ptr__,ModuleRunnerBase<wasm::ModuleRunner> *this,Call *curr)

{
  char **this_00;
  bool bVar1;
  byte bVar2;
  ExpressionRunner<wasm::ModuleRunner> *pEVar3;
  Importable *this_01;
  Module *module;
  Literal *pLVar4;
  Name NVar5;
  Literals local_1e0;
  Literals local_1a8;
  string_view local_170;
  Literals local_160;
  undefined1 local_128 [8];
  Literal target;
  Literals newArguments;
  Function *func;
  undefined1 local_a0 [8];
  Flow flow;
  Literals arguments;
  Call *curr_local;
  ModuleRunnerBase<wasm::ModuleRunner> *this_local;
  Flow *ret;
  
  this_00 = &flow.breakTo.super_IString.str._M_str;
  Literals::Literals((Literals *)this_00);
  pEVar3 = (ExpressionRunner<wasm::ModuleRunner> *)self(this);
  ExpressionRunner<wasm::ModuleRunner>::generateArguments
            ((Flow *)local_a0,pEVar3,&curr->operands,(Literals *)this_00);
  bVar1 = Flow::breaking((Flow *)local_a0);
  if (bVar1) {
    Flow::Flow(__return_storage_ptr__,(Flow *)local_a0);
  }
  else {
    NVar5.super_IString.str._M_str = (char *)(curr->target).super_IString.str._M_len;
    NVar5.super_IString.str._M_len = (size_t)this->wasm;
    this_01 = (Importable *)::wasm::Module::getFunction(NVar5);
    Flow::Flow(__return_storage_ptr__);
    pEVar3 = (ExpressionRunner<wasm::ModuleRunner> *)self(this);
    module = ExpressionRunner<wasm::ModuleRunner>::getModule(pEVar3);
    Intrinsics::Intrinsics
              ((Intrinsics *)
               &newArguments.super_SmallVector<wasm::Literal,_1UL>.flexible.
                super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage,module);
    bVar2 = ::wasm::Intrinsics::isCallWithoutEffects
                      ((Function *)
                       &newArguments.super_SmallVector<wasm::Literal,_1UL>.flexible.
                        super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
                        super__Vector_impl_data._M_end_of_storage);
    if ((bVar2 & 1) == 0) {
      bVar1 = Importable::imported(this_01);
      if (bVar1) {
        (*this->externalInterface->_vptr_ExternalInterface[4])
                  (&local_1a8,this->externalInterface,this_01,&flow.breakTo.super_IString.str._M_str
                  );
        Literals::operator=(&__return_storage_ptr__->values,&local_1a8);
        Literals::~Literals(&local_1a8);
      }
      else {
        callFunctionInternal
                  (&local_1e0,this,(Name)(curr->target).super_IString.str,
                   (Literals *)&flow.breakTo.super_IString.str._M_str);
        Literals::operator=(&__return_storage_ptr__->values,&local_1e0);
        Literals::~Literals(&local_1e0);
      }
    }
    else {
      Literals::Literals((Literals *)&target.type,(Literals *)&flow.breakTo.super_IString.str._M_str
                        );
      pLVar4 = SmallVector<wasm::Literal,_1UL>::back
                         ((SmallVector<wasm::Literal,_1UL> *)&target.type);
      ::wasm::Literal::Literal((Literal *)local_128,pLVar4);
      SmallVector<wasm::Literal,_1UL>::pop_back((SmallVector<wasm::Literal,_1UL> *)&target.type);
      local_170 = (string_view)wasm::Literal::getFunc((Literal *)local_128);
      callFunctionInternal(&local_160,this,(Name)local_170,(Literals *)&target.type);
      Literals::operator=(&__return_storage_ptr__->values,&local_160);
      Literals::~Literals(&local_160);
      ::wasm::Literal::~Literal((Literal *)local_128);
      Literals::~Literals((Literals *)&target.type);
    }
    if ((curr->isReturn & 1U) != 0) {
      Name::operator=(&__return_storage_ptr__->breakTo,(Name *)&RETURN_FLOW);
    }
  }
  Flow::~Flow((Flow *)local_a0);
  Literals::~Literals((Literals *)&flow.breakTo.super_IString.str._M_str);
  return __return_storage_ptr__;
}

Assistant:

Flow visitCall(Call* curr) {
    NOTE_ENTER("Call");
    NOTE_NAME(curr->target);
    Literals arguments;
    Flow flow = self()->generateArguments(curr->operands, arguments);
    if (flow.breaking()) {
      return flow;
    }
    auto* func = wasm.getFunction(curr->target);
    Flow ret;
    if (Intrinsics(*self()->getModule()).isCallWithoutEffects(func)) {
      // The call.without.effects intrinsic is a call to an import that actually
      // calls the given function reference that is the final argument.
      auto newArguments = arguments;
      auto target = newArguments.back();
      newArguments.pop_back();
      ret.values = callFunctionInternal(target.getFunc(), newArguments);
    } else if (func->imported()) {
      ret.values = externalInterface->callImport(func, arguments);
    } else {
      ret.values = callFunctionInternal(curr->target, arguments);
    }
#ifdef WASM_INTERPRETER_DEBUG
    std::cout << "(returned to " << scope->function->name << ")\n";
#endif
    // TODO: make this a proper tail call (return first)
    if (curr->isReturn) {
      ret.breakTo = RETURN_FLOW;
    }
    return ret;
  }